

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

Value * __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::
InnerMap::operator[]
          (InnerMap *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k)

{
  pointer this_00;
  value_type **ppvVar1;
  pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::InnerMap::iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::KeyValuePair>,_bool>
  local_60;
  undefined1 local_40 [8];
  KeyValuePair kv;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k_local;
  InnerMap *this_local;
  
  kv.v_ = (value_type *)k;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::
  KeyValuePair::KeyValuePair((KeyValuePair *)local_40,k,(value_type *)0x0);
  insert(&local_60,this,(KeyValuePair *)local_40);
  this_00 = iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::KeyValuePair>
            ::operator->(&local_60.first);
  ppvVar1 = Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
            ::KeyValuePair::value(this_00);
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::
  KeyValuePair::~KeyValuePair((KeyValuePair *)local_40);
  return ppvVar1;
}

Assistant:

Value& operator[](const Key& k) {
      KeyValuePair kv(k, Value());
      return insert(kv).first->value();
    }